

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlFreeValidCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlValidCtxtPyCtxtPtr local_40;
  undefined *local_38;
  PyObject *pyobj_cur;
  xmlValidCtxtPyCtxtPtr pyCtxt;
  xmlValidCtxtPtr cur;
  PyObject *args_local;
  PyObject *self_local;
  
  cur = (xmlValidCtxtPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeValidCtxt",&local_38);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_38 == &_Py_NoneStruct) {
      local_40 = (xmlValidCtxtPyCtxtPtr)0x0;
    }
    else {
      local_40 = *(xmlValidCtxtPyCtxtPtr *)(local_38 + 0x10);
    }
    pyCtxt = local_40;
    pyobj_cur = local_40->warn;
    if (pyobj_cur != (PyObject *)0x0) {
      _Py_XDECREF((PyObject *)pyobj_cur->ob_type);
      _Py_XDECREF((PyObject *)pyobj_cur->ob_refcnt);
      _Py_XDECREF((PyObject *)pyobj_cur[1].ob_refcnt);
      (*_xmlFree)(pyobj_cur);
    }
    xmlFreeValidCtxt(pyCtxt);
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlFreeValidCtxt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlValidCtxtPtr cur;
    xmlValidCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_cur;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeValidCtxt", &pyobj_cur))
        return(NULL);
    cur = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_cur);

    pyCtxt = (xmlValidCtxtPyCtxtPtr)(cur->userData);
    if (pyCtxt != NULL)
    {
            Py_XDECREF(pyCtxt->error);
            Py_XDECREF(pyCtxt->warn);
            Py_XDECREF(pyCtxt->arg);
            xmlFree(pyCtxt);
    }

    xmlFreeValidCtxt(cur);
    Py_INCREF(Py_None);
    return(Py_None);
}